

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  pIVar2 = (this->CmdBuffer).Data;
  iVar1 = (this->CmdBuffer).Size;
  if (pIVar2[(long)iVar1 + -1].ElemCount == 0) {
    if ((((1 < iVar1) &&
         (auVar4[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.x ==
                       *(char *)&(this->_CmdHeader).ClipRect.x),
         auVar4[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
         auVar4[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
         auVar4[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.x + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
         auVar4[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.y ==
                      *(char *)&(this->_CmdHeader).ClipRect.y),
         auVar4[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
         auVar4[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
         auVar4[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.y + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
         auVar4[8] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.z ==
                      *(char *)&(this->_CmdHeader).ClipRect.z),
         auVar4[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
         auVar4[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 2) ==
                       *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
         auVar4[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.z + 3) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
         auVar4[0xc] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                        *(char *)&(this->_CmdHeader).ClipRect.w),
         auVar4[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
         auVar4[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
         auVar4[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
         auVar3[0] = -(*(char *)&pIVar2[(long)iVar1 + -2].ClipRect.w ==
                      *(char *)&(this->_CmdHeader).ClipRect.w),
         auVar3[1] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
         auVar3[2] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
         auVar3[3] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].ClipRect.w + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
         auVar3[4] = -(*(char *)&pIVar2[(long)iVar1 + -2].TextureId ==
                      *(char *)&(this->_CmdHeader).TextureId),
         auVar3[5] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 1) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
         auVar3[6] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 2) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
         auVar3[7] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 3) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
         auVar3[8] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 4) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
         auVar3[9] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 5) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
         auVar3[10] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 6) ==
                       *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
         auVar3[0xb] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].TextureId + 7) ==
                        *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
         auVar3[0xc] = -((char)pIVar2[(long)iVar1 + -2].VtxOffset ==
                        (char)(this->_CmdHeader).VtxOffset),
         auVar3[0xd] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 1) ==
                        *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
         auVar3[0xe] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 2) ==
                        *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
         auVar3[0xf] = -(*(char *)((long)&pIVar2[(long)iVar1 + -2].VtxOffset + 3) ==
                        *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)),
         auVar3 = auVar3 & auVar4,
         (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff)) &&
        (pIVar2[(long)iVar1 + -2].ElemCount + pIVar2[(long)iVar1 + -2].IdxOffset ==
         pIVar2[(long)iVar1 + -1].IdxOffset)) &&
       (pIVar2[(long)iVar1 + -2].UserCallback == (ImDrawCallback)0x0)) {
      (this->CmdBuffer).Size = iVar1 + -1;
      return;
    }
  }
  else if (pIVar2[(long)iVar1 + -1].TextureId != (this->_CmdHeader).TextureId) {
    AddDrawCmd(this);
    return;
  }
  pIVar2[(long)iVar1 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}